

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O0

void __thiscall FRandom::GenRandArray(FRandom *this,w128_t *array,int size)

{
  QWORD *pQVar1;
  w128_t *local_38;
  w128_t *r2;
  w128_t *r1;
  int local_20;
  int j;
  int i;
  int size_local;
  w128_t *array_local;
  FRandom *this_local;
  
  r2 = (this->sfmt).w128 + 3;
  local_38 = (this->sfmt).w128 + 4;
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    do_recursion(array + local_20,(w128_t *)((long)&this->sfmt + (long)local_20 * 0x10),
                 (w128_t *)((long)&this->sfmt + (long)(local_20 + 2) * 0x10),r2,local_38);
    r2 = local_38;
    local_38 = array + local_20;
  }
  for (; local_20 < 5; local_20 = local_20 + 1) {
    do_recursion(array + local_20,(w128_t *)((long)&this->sfmt + (long)local_20 * 0x10),
                 array + (local_20 + -3),r2,local_38);
    r2 = local_38;
    local_38 = array + local_20;
  }
  for (; local_20 < size + -5; local_20 = local_20 + 1) {
    do_recursion(array + local_20,array + (local_20 + -5),array + (local_20 + -3),r2,local_38);
    r2 = local_38;
    local_38 = array + local_20;
  }
  for (r1._4_4_ = 0; r1._4_4_ < 10 - size; r1._4_4_ = r1._4_4_ + 1) {
    pQVar1 = (QWORD *)((long)&this->sfmt + (long)r1._4_4_ * 0x10);
    *pQVar1 = array[r1._4_4_ + size + -5].u64[0];
    pQVar1[1] = array[r1._4_4_ + size + -5].u64[1];
  }
  for (; local_20 < size; local_20 = local_20 + 1) {
    do_recursion(array + local_20,array + (local_20 + -5),array + (local_20 + -3),r2,local_38);
    r2 = local_38;
    local_38 = array + local_20;
    pQVar1 = (QWORD *)((long)&this->sfmt + (long)r1._4_4_ * 0x10);
    *pQVar1 = array[local_20].u64[0];
    pQVar1[1] = array[local_20].u64[1];
    r1._4_4_ = r1._4_4_ + 1;
  }
  return;
}

Assistant:

void FRandom::GenRandArray(w128_t *array, int size)
{
	int i, j;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < size - SFMT::N; i++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (j = 0; j < 2 * SFMT::N - size; j++) {
		sfmt.w128[j] = array[j + size - SFMT::N];
	}
	for (; i < size; i++, j++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
		sfmt.w128[j] = array[i];
	}
}